

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool test3(void)

{
  ostream *poVar1;
  int iVar2;
  int *x;
  int *piVar3;
  vector<int,_std::allocator<int>_> v;
  Queue q;
  
  CP::queue<int>::queue(&q);
  iVar2 = 100;
  while (iVar2 != 0) {
    v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start._0_4_ =
         iVar2;
    CP::queue<int>::push(&q,(int *)&v);
    iVar2 = iVar2 + -1;
  }
  CP::queue<int>::to_vector(&v,&q,0x14);
  for (piVar3 = (int *)CONCAT44(v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                (int)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start);
      piVar3 != v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish; piVar3 = piVar3 + 1) {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar3);
    std::operator<<(poVar1," ");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&v.super__Vector_base<int,_std::allocator<int>_>);
  CP::queue<int>::~queue(&q);
  return true;
}

Assistant:

bool test3() {
  Queue q;
  for (int i = 0;i < 100;i++)
    q.push(100-i);
  vector<int> v = q.to_vector(20);
  for (auto &x : v) {
    cout << x << " ";
  }
  cout << endl;
  return true;
}